

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O1

void __thiscall
sjtu::OrderManager::refund_ticket
          (OrderManager *this,UserManager *user_manager,TrainManager *train_manager,int argc,
          string *argv)

{
  char *__s;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar1;
  FileManager<std::pair<sjtu::orderType,_long>_> *pFVar2;
  OrderManager *pOVar3;
  UserManager *this_00;
  bool bVar4;
  int iVar5;
  int *piVar6;
  orderType *order;
  size_t sVar7;
  orderType *order_00;
  long *plVar8;
  undefined8 uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *ppVar13;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *__nptr;
  ulong uVar14;
  string *psVar15;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> pendinglist;
  string uname;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  local_f8;
  OrderManager *local_e0;
  pair<unsigned_long_long,_int> local_d8;
  char *local_c8;
  long local_c0;
  char local_b8;
  undefined7 uStack_b7;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  UserManager *local_88;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *local_80;
  long local_78;
  undefined1 local_70 [16];
  string local_60;
  ulong local_40;
  undefined4 local_38;
  undefined4 extraout_var;
  
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = '\0';
  local_f8.file =
       (DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        *)train_manager;
  local_e0 = this;
  local_88 = user_manager;
  if (argc < 1) {
    iVar5 = 1;
  }
  else {
    psVar15 = argv + 1;
    ppVar13 = (pair<const_std::pair<unsigned_long_long,_int>,_long> *)0x1;
    iVar11 = 0;
    do {
      iVar5 = std::__cxx11::string::compare((char *)(psVar15 + -1));
      if (iVar5 == 0) {
        std::__cxx11::string::_M_assign((string *)&local_c8);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)(psVar15 + -1));
        if (iVar5 == 0) {
          __nptr = (pair<const_std::pair<unsigned_long_long,_int>,_long> *)
                   (psVar15->_M_dataplus)._M_p;
          piVar6 = __errno_location();
          iVar5 = *piVar6;
          *piVar6 = 0;
          ppVar13 = (pair<const_std::pair<unsigned_long_long,_int>,_long> *)
                    strtol((char *)__nptr,(char **)&local_f8,10);
          if ((pair<const_std::pair<unsigned_long_long,_int>,_long> *)local_f8._0_8_ == __nptr) {
LAB_0010a394:
            uVar9 = std::__throw_invalid_argument("stoi");
            if (local_80 != __nptr) {
              operator_delete(local_80,local_70._0_8_ + 1);
            }
            if (local_a8 != local_98) {
              operator_delete(local_a8,local_98[0] + 1);
            }
            if (local_c8 != &local_b8) {
              operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
            }
            _Unwind_Resume(uVar9);
          }
          if (((pair<const_std::pair<unsigned_long_long,_int>,_long> *)(long)(int)ppVar13 != ppVar13
              ) || (__nptr = ppVar13, *piVar6 == 0x22)) {
            std::__throw_out_of_range("stoi");
            goto LAB_0010a394;
          }
          if (*piVar6 == 0) {
            *piVar6 = iVar5;
          }
        }
      }
      iVar5 = (int)ppVar13;
      psVar15 = psVar15 + 2;
      iVar11 = iVar11 + 2;
    } while (iVar11 < argc);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)local_70 + 0x10),local_c8,local_c8 + local_c0);
  this_00 = local_88;
  bVar4 = UserManager::is_login(local_88,(string *)((long)local_70 + 0x10));
  pOVar3 = local_e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    order = (orderType *)operator_new(0xb8);
    order->date[1].month = 0;
    order->date[1].day = 0;
    order->date[1].hour = 0;
    order->date[1].minute = 0;
    order->date[0].month = 0;
    order->date[0].day = 0;
    order->date[0].hour = 0;
    order->date[0].minute = 0;
    strcpy((char *)order,local_c8);
    bVar4 = UserManager::refund_order(this_00,pOVar3,iVar5,order);
    if (bVar4) {
      if (order->status == success) {
        TrainManager::refund_ticket((TrainManager *)local_f8.file,order);
        pBVar1 = pOVar3->PendingBpTree;
        __s = order->trainID;
        local_a8 = local_98;
        sVar7 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,__s,order->trainID + sVar7);
        if (local_a0 == 0) {
          local_d8.first = 0;
        }
        else {
          lVar12 = 0;
          lVar10 = 0;
          local_d8.first = 0;
          do {
            uVar14 = (ulong)((int)*(char *)((long)local_a8 + lVar12) + 0x100);
            lVar10 = (long)(lVar10 * 0x239 + uVar14) % 0x3b800001;
            local_d8.first = (long)(local_d8.first * 0x301 + uVar14) % 0x3b9aca07;
            lVar12 = lVar12 + 1;
          } while (local_a0 != lVar12);
          local_d8.first = lVar10 << 0x20 | local_d8.first;
        }
        local_d8.second = 0;
        local_80 = (pair<const_std::pair<unsigned_long_long,_int>,_long> *)local_70;
        sVar7 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar7);
        if (local_78 == 0) {
          local_40 = 0;
        }
        else {
          lVar12 = 0;
          lVar10 = 0;
          local_40 = 0;
          do {
            uVar14 = (ulong)((int)*(char *)((long)&(local_80->first).first + lVar12) + 0x100);
            lVar10 = (long)(lVar10 * 0x239 + uVar14) % 0x3b800001;
            local_40 = (long)(local_40 * 0x301 + uVar14) % 0x3b9aca07;
            lVar12 = lVar12 + 1;
          } while (local_78 != lVar12);
          local_40 = lVar10 << 0x20 | local_40;
        }
        local_38 = 0x7fffffff;
        BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        ::range_query(&local_f8,(pair<unsigned_long_long,_int> *)pBVar1,&local_d8);
        pOVar3 = local_e0;
        if (local_80 != (pair<const_std::pair<unsigned_long_long,_int>,_long> *)local_70) {
          operator_delete(local_80,local_70._0_8_ + 1);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        if ((uint)local_f8.root != 0) {
          uVar14 = 0;
          do {
            pFVar2 = pOVar3->OrderFile;
            local_d8.first = uVar14;
            vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::operator[]
                      ((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)
                       &local_f8,&local_d8.first);
            iVar5 = (*(pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                      _vptr_FileManager_Base[2])(pFVar2);
            order_00 = (orderType *)CONCAT44(extraout_var,iVar5);
            if (((order_00->status != refunded) &&
                (bVar4 = TrainManager::buy_ticket((TrainManager *)local_f8.file,order_00), bVar4))
               && (order_00->status != pending)) {
              (*(pOVar3->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                _vptr_FileManager_Base[3])(pOVar3->OrderFile,&order_00->offset);
              pBVar1 = pOVar3->PendingBpTree;
              local_d8.first = uVar14;
              ppVar13 = vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::
                        operator[]((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>
                                    *)&local_f8,&local_d8.first);
              BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              ::erase(pBVar1,&ppVar13->first);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < (uint)local_f8.root);
        }
        operator_delete((void *)local_f8._0_8_);
      }
      plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    }
    else {
      plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    }
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    operator_delete(order,0xb8);
  }
  else {
    plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  return;
}

Assistant:

void refund_ticket(UserManager *user_manager, TrainManager *train_manager, int argc, std::string *argv) {
            std::string uname;
            int number = 1;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") uname = argv[i + 1];
                else if (argv[i] == "-n") number = stoi(argv[i + 1]);
            }
            if (user_manager->is_login(uname) == false) std::cout << -1 << std::endl;
            else {
                orderType *tmp = new orderType;
                strcpy(tmp->username, uname.c_str());
                if (user_manager->refund_order(this, number, tmp)) {
                    if (tmp -> status == success)
                    {
                        train_manager -> refund_ticket(tmp);
                        auto pendinglist = PendingBpTree -> range_query(
                                std::make_pair(hasher(tmp -> trainID) , 0) ,
                                std::make_pair(hasher(tmp -> trainID) , 0x7fffffff));
                        for (int i = 0 ; i < pendinglist . size() ; ++ i)
                        {
                            auto ret = OrderFile -> read(pendinglist[i] . second);
                            if (ret -> first . status != refunded && train_manager -> buy_ticket(&(ret -> first)))
                                if (ret -> first . status != pending)
                                {
                                    OrderFile -> save(ret -> first . offset);
                                    PendingBpTree -> erase(pendinglist[i] . first);
                                }
                        }
                    }
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
                delete tmp;
            }
        }